

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case_expression.hpp
# Opt level: O1

string * __thiscall
duckdb::CaseExpression::ToString<duckdb::CaseExpression,duckdb::ParsedExpression>
          (string *__return_storage_ptr__,CaseExpression *this,CaseExpression *entry)

{
  pointer pCVar1;
  pointer pPVar2;
  long *plVar3;
  long *plVar4;
  pointer this_00;
  long *local_a0;
  long local_90;
  long lStack_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  CaseExpression *local_38;
  
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"CASE ","");
  this_00 = (this->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
            super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (this->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
           super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = this;
  if (this_00 != pCVar1) {
    do {
      pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(&this_00->when_expr);
      (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(local_58);
      plVar3 = (long *)::std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x1388c8c);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_68 = *plVar4;
        lStack_60 = plVar3[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar4;
        local_78 = (long *)*plVar3;
      }
      local_70 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)::std::__cxx11::string::append((char *)&local_78);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_90 = *plVar4;
        lStack_88 = plVar3[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar4;
        local_a0 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
      pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(&this_00->then_expr);
      (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(local_58);
      plVar3 = (long *)::std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x1388c94);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_68 = *plVar4;
        lStack_60 = plVar3[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar4;
        local_78 = (long *)*plVar3;
      }
      local_70 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)::std::__cxx11::string::append((char *)&local_78);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_90 = *plVar4;
        lStack_88 = plVar3[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar4;
        local_a0 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pCVar1);
  }
  pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&local_38->else_expr);
  (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_78);
  plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x1388c9c);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_90 = *plVar4;
    lStack_88 = plVar3[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar4;
    local_a0 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry) {
		string case_str = "CASE ";
		for (auto &check : entry.case_checks) {
			case_str += " WHEN (" + check.when_expr->ToString() + ")";
			case_str += " THEN (" + check.then_expr->ToString() + ")";
		}
		case_str += " ELSE " + entry.else_expr->ToString();
		case_str += " END";
		return case_str;
	}